

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  int iVar2;
  pointer pBVar3;
  Net *pNVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar6;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar7;
  int *piVar8;
  int j_1;
  char *pcVar9;
  int j;
  long lVar10;
  size_t sStack_a00;
  int top_count;
  int bottom_count;
  int local_9f0;
  int typeindex;
  int blob_count;
  int layer_count;
  Layer *local_9e0;
  Mat local_9d8;
  Net *local_990;
  int magic;
  vector<int,_std::allocator<int>_> *local_980;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_978;
  Mat shape_hints;
  ParamDict pd;
  
  magic = 0;
  local_990 = this;
  iVar5 = (*dr->_vptr_DataReader[3])(dr,&magic,4);
  if (CONCAT44(extraout_var,iVar5) == 4) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar5 = (*dr->_vptr_DataReader[3])(dr,&layer_count,4);
      if (CONCAT44(extraout_var_00,iVar5) == 4) {
        iVar5 = (*dr->_vptr_DataReader[3])(dr,&blob_count,4);
        pNVar4 = local_990;
        if (CONCAT44(extraout_var_01,iVar5) == 4) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            local_978 = &local_990->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_978,(long)layer_count);
            this_00 = &pNVar4->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)blob_count);
            ParamDict::ParamDict(&pd);
            local_9f0 = 0;
            do {
              if (layer_count <= local_9f0) {
                iVar5 = 0;
LAB_0012e878:
                ParamDict::~ParamDict(&pd);
                return iVar5;
              }
              iVar5 = (*dr->_vptr_DataReader[3])(dr,&typeindex,4);
              if (CONCAT44(extraout_var_02,iVar5) != 4) {
                pcVar9 = "read typeindex failed";
LAB_0012e955:
                sStack_a00 = 0x15;
LAB_0012e85d:
                fwrite(pcVar9,sStack_a00,1,_stderr);
                fputc(10,_stderr);
LAB_0012e871:
                iVar5 = -1;
                goto LAB_0012e878;
              }
              iVar5 = (*dr->_vptr_DataReader[3])(dr,&bottom_count,4);
              if (CONCAT44(extraout_var_03,iVar5) != 4) {
                pcVar9 = "read bottom_count failed";
                sStack_a00 = 0x18;
                goto LAB_0012e85d;
              }
              iVar5 = (*dr->_vptr_DataReader[3])(dr,&top_count,4);
              if (CONCAT44(extraout_var_04,iVar5) != 4) {
                pcVar9 = "read top_count failed";
                goto LAB_0012e955;
              }
              pLVar6 = create_layer(typeindex);
              if ((pLVar6 == (Layer *)0x0) &&
                 (pLVar6 = create_custom_layer(local_990,typeindex & 0xfffffeff),
                 pLVar6 == (Layer *)0x0)) {
                fprintf(_stderr,"layer %d not exists or registered",(ulong)(uint)typeindex);
                fputc(10,_stderr);
                clear(local_990);
                goto LAB_0012e871;
              }
              local_980 = &pLVar6->bottoms;
              std::vector<int,_std::allocator<int>_>::resize(local_980,(long)bottom_count);
              local_9e0 = pLVar6;
              for (lVar7 = 0; lVar7 < bottom_count; lVar7 = lVar7 + 1) {
                iVar5 = (*dr->_vptr_DataReader[3])(dr,&shape_hints,4);
                if (CONCAT44(extraout_var_05,iVar5) != 4) {
                  pcVar9 = "read bottom_blob_index failed";
                  sStack_a00 = 0x1d;
                  goto LAB_0012e85d;
                }
                std::vector<int,_std::allocator<int>_>::push_back
                          (&(this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                            _M_impl.super__Vector_impl_data._M_start[(int)shape_hints.data].
                            consumers,&local_9f0);
                (local_980->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7] = (int)shape_hints.data;
              }
              this_01 = &local_9e0->tops;
              std::vector<int,_std::allocator<int>_>::resize(this_01,(long)top_count);
              for (lVar7 = 0; lVar7 < top_count; lVar7 = lVar7 + 1) {
                iVar5 = (*dr->_vptr_DataReader[3])(dr,&shape_hints,4);
                if (CONCAT44(extraout_var_06,iVar5) != 4) {
                  pcVar9 = "read top_blob_index failed";
                  sStack_a00 = 0x1a;
                  goto LAB_0012e85d;
                }
                (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)shape_hints.data].producer = local_9f0;
                (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7] = (int)shape_hints.data;
              }
              iVar5 = ParamDict::load_param_bin(&pd,dr);
              if (iVar5 == 0) {
                local_9d8.elemsize._0_4_ = 0;
                local_9d8.elemsize._4_4_ = 0;
                local_9d8.elempack = 0;
                local_9d8.data = (void *)0x0;
                local_9d8.refcount._0_4_ = 0;
                local_9d8.refcount._4_4_ = 0;
                local_9d8.h = 0;
                local_9d8.c = 0;
                local_9d8.cstep = 0;
                local_9d8.allocator = (Allocator *)0x0;
                local_9d8.dims = 0;
                local_9d8.w = 0;
                ParamDict::get(&shape_hints,&pd,0x1e,&local_9d8);
                Mat::~Mat(&local_9d8);
                if ((CONCAT44(shape_hints.data._4_4_,(int)shape_hints.data) != 0) &&
                   ((long)shape_hints.c * shape_hints.cstep != 0)) {
                  piVar8 = (int *)(CONCAT44(shape_hints.data._4_4_,(int)shape_hints.data) + 8);
                  for (lVar7 = 0; lVar7 < top_count; lVar7 = lVar7 + 1) {
                    iVar5 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar7];
                    pBVar3 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    iVar2 = piVar8[-2];
                    if (iVar2 == 3) {
                      local_9d8.h = piVar8[0];
                      local_9d8.c = piVar8[1];
                      local_9d8.data = (void *)0x0;
                      local_9d8.refcount._0_4_ = 0;
                      local_9d8.refcount._4_4_ = 0;
                      local_9d8.elemsize._0_4_ = 4;
                      local_9d8.elemsize._4_4_ = 0;
                      local_9d8.elempack = 1;
                      local_9d8.allocator = (Allocator *)0x0;
                      local_9d8.w = piVar8[-1];
                      local_9d8.dims = 3;
                      local_9d8.cstep = (long)(local_9d8.h * piVar8[-1]) + 3U & 0x3ffffffffffffffc;
                      Mat::operator=(&pBVar3[iVar5].shape,&local_9d8);
LAB_0012e6da:
                      Mat::~Mat(&local_9d8);
                    }
                    else {
                      if (iVar2 == 2) {
                        local_9d8.data = (void *)0x0;
                        local_9d8.refcount._0_4_ = 0;
                        local_9d8.refcount._4_4_ = 0;
                        local_9d8.elemsize._0_4_ = 4;
                        local_9d8.elemsize._4_4_ = 0;
                        local_9d8.elempack = 1;
                        local_9d8.allocator = (Allocator *)0x0;
                        local_9d8.w = piVar8[-1];
                        local_9d8.dims = 2;
                        local_9d8.c = 1;
                        local_9d8.h = *piVar8;
                        local_9d8.cstep = (size_t)(*piVar8 * piVar8[-1]);
                        Mat::operator=(&pBVar3[iVar5].shape,&local_9d8);
                        goto LAB_0012e6da;
                      }
                      if (iVar2 == 1) {
                        local_9d8.cstep = (size_t)piVar8[-1];
                        local_9d8.data = (void *)0x0;
                        local_9d8.refcount._0_4_ = 0;
                        local_9d8.refcount._4_4_ = 0;
                        local_9d8.elemsize._0_4_ = 4;
                        local_9d8.elemsize._4_4_ = 0;
                        local_9d8.elempack = 1;
                        local_9d8.allocator = (Allocator *)0x0;
                        local_9d8.w = piVar8[-1];
                        local_9d8.dims = 1;
                        local_9d8.h = 1;
                        local_9d8.c = 1;
                        Mat::operator=(&pBVar3[iVar5].shape,&local_9d8);
                        goto LAB_0012e6da;
                      }
                    }
                    piVar8 = piVar8 + 4;
                  }
                }
                pvVar1 = &local_9e0->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (pvVar1,(long)bottom_count);
                lVar7 = 0;
                for (lVar10 = 0; lVar10 < bottom_count; lVar10 = lVar10 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar1->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar7),
                                 &(this_00->
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(local_980->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[lVar10]].shape);
                  lVar7 = lVar7 + 0x40;
                }
                pvVar1 = &local_9e0->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)top_count);
                lVar7 = 0;
                for (lVar10 = 0; pLVar6 = local_9e0, lVar10 < top_count; lVar10 = lVar10 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar1->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar7),
                                 &(this_00->
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[lVar10]].shape);
                  lVar7 = lVar7 + 0x40;
                }
                iVar5 = (*local_9e0->_vptr_Layer[2])(local_9e0,&pd);
                if (iVar5 == 0) {
                  (local_978->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[local_9f0] = pLVar6;
                }
                else {
                  fwrite("layer load_param failed",0x17,1,_stderr);
                  fputc(10,_stderr);
                }
                Mat::~Mat(&shape_hints);
              }
              else {
                fwrite("ParamDict load_param failed",0x1b,1,_stderr);
                fputc(10,_stderr);
              }
              local_9f0 = local_9f0 + 1;
            } while( true );
          }
          pcVar9 = "invalid layer_count or blob_count";
          sStack_a00 = 0x21;
        }
        else {
          pcVar9 = "read blob_count failed";
          sStack_a00 = 0x16;
        }
      }
      else {
        pcVar9 = "read layer_count failed";
        sStack_a00 = 0x17;
      }
    }
    else {
      pcVar9 = "param is too old, please regenerate";
      sStack_a00 = 0x23;
    }
  }
  else {
    pcVar9 = "read magic failed";
    sStack_a00 = 0x11;
  }
  fwrite(pcVar9,sStack_a00,1,_stderr);
  fputc(10,_stderr);
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        NCNN_LOGE("read " #buf " failed"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;

#if __APPLE__
        opt.use_image_storage = false;
#endif
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param failed");
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param failed");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}